

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridDataType2::Decode(GridDataType2 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  ushort local_56;
  float local_54;
  KUINT16 i;
  KFLOAT32 tmp;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  GridDataType2 *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 8) {
    i._1_1_ = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    i._1_1_ = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::vector<float,_std::allocator<float>_>::clear(&this->m_vf32Values);
  GridData::Decode(&this->super_GridData,local_18);
  KDataStream::operator>>(local_18,(unsigned_short *)&(this->super_GridData).field_0xc);
  local_54 = 0.0;
  for (local_56 = 0; local_56 < *(ushort *)&(this->super_GridData).field_0xc;
      local_56 = local_56 + 1) {
    KDataStream::operator>>(local_18,&local_54);
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_vf32Values,&local_54);
  }
  KDataStream::operator>>(local_18,&this->m_ui16Padding);
  return;
}

Assistant:

void GridDataType2::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_DATA_TYPE2_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vf32Values.clear();

    GridData::Decode( stream );

    stream >> m_ui16NumValues;

    KFLOAT32 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumValues; ++i )
    {
        stream >> tmp;
        m_vf32Values.push_back( tmp );
    }

    stream >> m_ui16Padding;
}